

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::clara::detail::BasicResult<Catch::clara::detail::ParseResultType>::BasicResult
          (BasicResult<Catch::clara::detail::ParseResultType> *this,
          BasicResult<Catch::clara::detail::ParseResultType> *param_1)

{
  BasicResult<Catch::clara::detail::ParseResultType> *param_1_local;
  BasicResult<Catch::clara::detail::ParseResultType> *this_local;
  
  ResultValueBase<Catch::clara::detail::ParseResultType>::ResultValueBase
            (&this->super_ResultValueBase<Catch::clara::detail::ParseResultType>,
             &param_1->super_ResultValueBase<Catch::clara::detail::ParseResultType>);
  (this->super_ResultValueBase<Catch::clara::detail::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f9850;
  ::std::__cxx11::string::string((string *)&this->m_errorMessage,(string *)&param_1->m_errorMessage)
  ;
  return;
}

Assistant:

explicit BasicResult( BasicResult<U> const &other )
        :   ResultValueBase<T>( other.type() ),
            m_errorMessage( other.errorMessage() )
        {
            assert( type() != ResultBase::Ok );
        }